

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O0

void Llb_ManComputeIndCase(Aig_Man_t *p,DdManager *dd,Vec_Int_t *vNodes)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Vec_Ptr_t *p_01;
  DdNode *pDVar2;
  Aig_Obj_t *pAVar3;
  int local_3c;
  int Entry;
  int i;
  DdNode *bFunc;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vBdds;
  Vec_Int_t *vNodes_local;
  DdManager *dd_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_01 = Vec_PtrStart(iVar1);
  pDVar2 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar2);
  pAVar3 = Aig_ManConst1(p);
  iVar1 = Aig_ObjId(pAVar3);
  Vec_PtrWriteEntry(p_01,iVar1,pDVar2);
  for (local_3c = 0; iVar1 = Saig_ManPiNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_3c);
    iVar1 = Aig_ManCiNum(p);
    pDVar2 = Cudd_bddIthVar(dd,iVar1 + local_3c);
    Cudd_Ref(pDVar2);
    iVar1 = Aig_ObjId(pAVar3);
    Vec_PtrWriteEntry(p_01,iVar1,pDVar2);
  }
  for (local_3c = 0; iVar1 = Saig_ManRegNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_3c + iVar1);
    pDVar2 = (DdNode *)(pAVar3->field_5).pData;
    Cudd_Ref(pDVar2);
    pAVar3 = Saig_ObjLiToLo(p,pAVar3);
    iVar1 = Aig_ObjId(pAVar3);
    Vec_PtrWriteEntry(p_01,iVar1,pDVar2);
  }
  for (local_3c = 0; iVar1 = Vec_IntSize(vNodes), local_3c < iVar1; local_3c = local_3c + 1) {
    iVar1 = Vec_IntEntry(vNodes,local_3c);
    if ((iVar1 == 0) || (iVar1 == 1)) {
      pAVar3 = Aig_ManObj(p,local_3c);
      pDVar2 = Llb_ManComputeIndCase_rec(p,pAVar3,dd,p_01);
      if (iVar1 == 0) {
        iVar1 = Cudd_bddLeq(dd,(DdNode *)((ulong)(pAVar3->field_5).pData ^ 1),
                            (DdNode *)((ulong)pDVar2 ^ 1));
        if (iVar1 == 0) {
          Vec_IntWriteEntry(vNodes,local_3c,-1);
        }
      }
      else if ((iVar1 == 1) &&
              (iVar1 = Cudd_bddLeq(dd,(DdNode *)(pAVar3->field_5).pData,pDVar2), iVar1 == 0)) {
        Vec_IntWriteEntry(vNodes,local_3c,-1);
      }
    }
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(p_01), local_3c < iVar1; local_3c = local_3c + 1) {
    pDVar2 = (DdNode *)Vec_PtrEntry(p_01,local_3c);
    if (pDVar2 != (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar2);
    }
  }
  Vec_PtrFree(p_01);
  return;
}

Assistant:

void Llb_ManComputeIndCase( Aig_Man_t * p, DdManager * dd, Vec_Int_t * vNodes )
{
    Vec_Ptr_t * vBdds;
    Aig_Obj_t * pObj;
    DdNode * bFunc;
    int i, Entry;
    vBdds = Vec_PtrStart( Aig_ManObjNumMax(p) );
    bFunc = Cudd_ReadOne(dd); Cudd_Ref( bFunc );
    Vec_PtrWriteEntry( vBdds, Aig_ObjId(Aig_ManConst1(p)), bFunc );
    Saig_ManForEachPi( p, pObj, i )
    {
        bFunc = Cudd_bddIthVar( dd, Aig_ManCiNum(p) + i );  Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vBdds, Aig_ObjId(pObj), bFunc );
    }
    Saig_ManForEachLi( p, pObj, i )
    {
        bFunc = (DdNode *)pObj->pData;  Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vBdds, Aig_ObjId(Saig_ObjLiToLo(p, pObj)), bFunc );
    }
    Vec_IntForEachEntry( vNodes, Entry, i )
    { 
        if ( Entry != 0 && Entry != 1 )
            continue;
        pObj = Aig_ManObj( p, i );
        bFunc = Llb_ManComputeIndCase_rec( p, pObj, dd, vBdds );
        if ( Entry == 0 )
        {
//            Extra_bddPrint( dd, Cudd_Not(pObj->pData) );  printf( "\n" );
//            Extra_bddPrint( dd, Cudd_Not(bFunc) );        printf( "\n" );
            if ( !Cudd_bddLeq( dd, Cudd_Not(pObj->pData), Cudd_Not(bFunc) ) )
                Vec_IntWriteEntry( vNodes, i, -1 );
        }
        else if ( Entry == 1 )
        {
//            Extra_bddPrint( dd, pObj->pData );  printf( "\n" );
//            Extra_bddPrint( dd, bFunc );        printf( "\n" );
            if ( !Cudd_bddLeq( dd, (DdNode *)pObj->pData, bFunc ) )
                Vec_IntWriteEntry( vNodes, i, -1 );
        }
    }
    Vec_PtrForEachEntry( DdNode *, vBdds, bFunc, i )
        if ( bFunc )
            Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vBdds );
}